

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
iterate(TestStatus *__return_storage_ptr__,
       DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  Context *this_00;
  TestLog *log;
  DeviceInterface *pDVar1;
  Image *this_01;
  TextureFormat TVar2;
  TestStatus *pTVar3;
  bool bVar4;
  int i;
  VkResult VVar5;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  long lVar6;
  char *__s;
  pointer puVar7;
  uint uVar8;
  ulong __n;
  deUint32 queueFamilyIndex;
  TextureLevel refImage;
  Move<vk::Handle<(vk::HandleType)8>_> indexBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  ConstPixelBufferAccess local_148;
  TestStatus *local_120;
  Allocator *local_118;
  ConstPixelBufferAccess renderedFrame;
  UVec4 local_e8;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkSubmitInfo submitInfo;
  IVec3 local_74;
  VkBufferCreateInfo bufferCreateInfo;
  
  this_00 = (this->super_DrawTestInstanceBase).super_TestInstance.m_context;
  log = this_00->m_testCtx->m_log;
  local_120 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(this_00);
  device = Context::getDevice((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  local_118 = Context::getDefaultAllocator
                        ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  vertexBufferOffset = 0;
  vertexBuffer.m_internal =
       (((this->super_DrawTestInstanceBase).m_vertexBuffer.m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestInstanceBase).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1,&vertexBuffer,
             &vertexBufferOffset);
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  __n = (ulong)(*(int *)&(this->m_data).super_IndexedParamsBase.indexes.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(this->m_data).super_IndexedParamsBase.indexes.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start & 0xfffffffc);
  bufferCreateInfo.usage = 0x40;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 1;
  bufferCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
  bufferCreateInfo.size = __n;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&refImage,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  submitInfo.waitSemaphoreCount = refImage.m_size.m_data[2];
  submitInfo._20_4_ = refImage._20_4_;
  submitInfo.pWaitSemaphores = (VkSemaphore *)refImage.m_data.m_ptr;
  submitInfo.sType = refImage.m_format.order;
  submitInfo._4_4_ = refImage.m_format.type;
  submitInfo.pNext = (void *)refImage.m_size.m_data._0_8_;
  refImage.m_format.order = R;
  refImage.m_format.type = SNORM_INT8;
  refImage.m_size.m_data[0] = 0;
  refImage.m_size.m_data[1] = 0;
  refImage.m_size.m_data[2] = 0;
  refImage._20_4_ = 0;
  refImage.m_data.m_ptr = (void *)0x0;
  if (indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)submitInfo._16_8_;
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       submitInfo._0_8_;
  indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)submitInfo.pNext;
  if (refImage.m_format != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&refImage.m_size,
               (VkBuffer)refImage.m_format);
  }
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&submitInfo,vk,device,
             (VkBuffer)
             indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  (*local_118->_vptr_Allocator[3])(&refImage,local_118,&submitInfo,1);
  TVar2 = refImage.m_format;
  VVar5 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,
                     indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                     m_internal,*(undefined8 *)((long)refImage.m_format + 8),
                     *(undefined8 *)((long)refImage.m_format + 0x10));
  ::vk::checkResult(VVar5,
                    "vk.bindBufferMemory(vkDevice, *indexBuffer, indexAlloc->getMemory(), indexAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x308);
  memcpy(*(void **)((long)TVar2 + 0x18),
         (this->m_data).super_IndexedParamsBase.indexes.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  ::vk::flushMappedMemoryRange
            ((this->super_DrawTestInstanceBase).m_vk,device,
             (VkDeviceMemory)*(deUint64 *)((long)TVar2 + 8),*(VkDeviceSize *)((long)TVar2 + 0x10),
             __n);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x57])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,
             (ulong)(this->m_data).super_IndexedParamsBase.indexType);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x5a])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (ulong)*(uint *)&(this->m_data).super_IndexedParamsBase.field_0x1c,
             (ulong)*(uint *)&(this->m_data).field_0x40,(ulong)*(uint *)&(this->m_data).field_0x44,
             (ulong)*(uint *)&(this->m_data).field_0x48,(ulong)*(uint *)&(this->m_data).field_0x4c);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x76])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4a])
            (pDVar1,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_DrawTestInstanceBase).m_cmdBuffer;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  VVar5 = (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue,1,&submitInfo,0);
  ::vk::checkResult(VVar5,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,799);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel(&refImage,&renderedFrame.m_format,0x100,0x100,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
  local_148.m_format.order = R;
  local_148.m_format.type = SNORM_INT8;
  local_148.m_size.m_data[0] = 0;
  local_148.m_size.m_data[1] = 0x3f800000;
  tcu::clear((PixelBufferAccess *)&renderedFrame,(Vec4 *)&local_148);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar7 = (this->m_data).super_IndexedParamsBase.indexes.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + *(uint *)&(this->m_data).field_0x44;
  if (puVar7 != (this->m_data).super_IndexedParamsBase.indexes.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      uVar8 = *puVar7 + *(int *)&(this->m_data).field_0x48;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&vertices,
                 &(this->m_data).super_DrawParamsBase.vertices.
                  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].position);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&colors,&(this->m_data).super_DrawParamsBase.vertices.
                          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8].color);
      puVar7 = puVar7 + 1;
    } while (puVar7 != (this->m_data).super_IndexedParamsBase.indexes.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
  DrawTestInstanceBase::generateRefImage
            (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&renderedFrame,&vertices,&colors
            );
  pDVar1 = (this->super_DrawTestInstanceBase).m_vk;
  VVar5 = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,queue);
  ::vk::checkResult(VVar5,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x330);
  this_01 = (this->super_DrawTestInstanceBase).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  Image::readSurface(&renderedFrame,this_01,queue,allocator,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_148,&refImage);
  if ((this->m_data).super_DrawParamsBase.topology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    lVar6 = 0;
    do {
      local_e8.m_data[lVar6] = 4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    local_74.m_data[0] = 1;
    local_74.m_data[1] = 1;
    local_74.m_data[2] = 0;
    bVar4 = tcu::intThresholdPositionDeviationCompare
                      (log,"Result","Image comparison result",&local_148,&renderedFrame,&local_e8,
                       &local_74,true,COMPARE_LOG_RESULT);
  }
  else {
    bVar4 = tcu::fuzzyCompare(log,"Result","Image comparison result",&local_148,&renderedFrame,0.05,
                              COMPARE_LOG_RESULT);
  }
  __s = qpGetTestResultName((uint)(bVar4 ^ 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,__s,(allocator<char> *)&local_e8);
  pTVar3 = local_120;
  local_120->m_code = (uint)(bVar4 ^ 1);
  (local_120->m_description)._M_dataplus._M_p = (pointer)&(local_120->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120->m_description,local_148.m_format,
             (undefined1 *)(local_148.m_size.m_data._0_8_ + (long)local_148.m_format));
  if (local_148.m_format != (TextureFormat)(local_148.m_size.m_data + 2)) {
    operator_delete((void *)local_148.m_format,local_148._16_8_ + 1);
  }
  if (colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(colors.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)colors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)colors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&refImage);
  if (TVar2 != (TextureFormat)0x0) {
    (**(code **)(*(long *)TVar2 + 8))(TVar2);
  }
  if (indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               indexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawIndexedParams>::iterate (void)
{
	tcu::TestLog				&log				= m_context.getTestContext().getLog();
	const vk::DeviceInterface&	vk					= m_context.getDeviceInterface();
	const vk::VkDevice			vkDevice			= m_context.getDevice();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const vk::VkQueue			queue				= m_context.getUniversalQueue();
	vk::Allocator&				allocator			= m_context.getDefaultAllocator();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset = 0;
	const vk::VkBuffer	vertexBuffer = m_vertexBuffer->object();

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);
	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const deUint32	bufferSize	= (deUint32)(m_data.indexes.size() * sizeof(deUint32));

	vk::Move<vk::VkBuffer>	indexBuffer;

	const vk::VkBufferCreateInfo	bufferCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT,		// VkBufferUsageFlags	usage;
		vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyIndexCount;
		&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
	};

	indexBuffer = createBuffer(vk, vkDevice, &bufferCreateInfo);

	de::MovePtr<vk::Allocation>	indexAlloc;

	indexAlloc = allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indexBuffer), vk::MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *indexBuffer, indexAlloc->getMemory(), indexAlloc->getOffset()));

	deMemcpy(indexAlloc->getHostPtr(), &(m_data.indexes[0]), bufferSize);

	vk::flushMappedMemoryRange(m_vk, vkDevice, indexAlloc->getMemory(), indexAlloc->getOffset(), bufferSize);

	m_vk.cmdBindIndexBuffer(*m_cmdBuffer, *indexBuffer, 0u, m_data.indexType);
	m_vk.cmdDrawIndexed(*m_cmdBuffer, m_data.params.indexCount, m_data.params.instanceCount, m_data.params.firstIndex, m_data.params.vertexOffset, m_data.params.firstInstance);
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel	refImage	(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	std::vector<tcu::Vec4>	vertices;
	std::vector<tcu::Vec4>	colors;

	for (std::vector<deUint32>::const_iterator it = m_data.indexes.begin() + m_data.params.firstIndex; it != m_data.indexes.end(); ++it)
	{
		deUint32 idx = m_data.params.vertexOffset + *it;
		vertices.push_back(m_data.vertices[idx].position);
		colors.push_back(m_data.vertices[idx].color);
	}
	generateRefImage(refImage.getAccess(), vertices, colors);

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}